

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Belief.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
Belief::InnerProduct
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,Belief *this,VectorSet *v
          )

{
  undefined1 auVar1 [16];
  size_type sVar2;
  pointer pdVar3;
  pointer pdVar4;
  size_type sVar5;
  pointer pdVar6;
  pointer pdVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  allocator_type local_19;
  
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,v->size1_,&local_19);
  sVar2 = v->size1_;
  if (sVar2 != 0) {
    pdVar3 = (this->_m_b).super_SDV.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->_m_b).super_SDV.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    sVar5 = v->size2_;
    pdVar7 = (v->data_).data_;
    pdVar6 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = 0;
    do {
      auVar11 = ZEXT864(0) << 0x40;
      dVar10 = 0.0;
      if (pdVar4 != pdVar3) {
        uVar9 = 0;
        do {
          auVar12._8_8_ = 0;
          auVar12._0_8_ = pdVar3[uVar9];
          auVar1._8_8_ = 0;
          auVar1._0_8_ = pdVar7[uVar9];
          auVar1 = vfmadd231sd_fma(auVar11._0_16_,auVar12,auVar1);
          auVar11 = ZEXT1664(auVar1);
          dVar10 = auVar1._0_8_;
          uVar9 = uVar9 + 1;
        } while ((long)pdVar4 - (long)pdVar3 >> 3 != (uVar9 & 0xffffffff));
      }
      pdVar6[uVar8] = dVar10;
      uVar8 = uVar8 + 1;
      pdVar7 = pdVar7 + sVar5;
    } while (sVar2 != (uVar8 & 0xffffffff));
  }
  return __return_storage_ptr__;
}

Assistant:

vector<double> Belief::InnerProduct(const VectorSet &v) const
{
    vector<double> values(v.size1());

    double x;
    for(unsigned int k=0;k!=v.size1();++k)
    {
        x=0;
        for(unsigned int s=0; s!=_m_b.size(); ++s)
            x+=_m_b[s]*v(k,s);
        values[k]=x;
    }

    return(values);
}